

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O3

void __thiscall
Centaurus::ParserEM64T<wchar_t>::emit_machine
          (ParserEM64T<wchar_t> *this,X86Assembler *as,ATNMachine<wchar_t> *machine,
          unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
          *machine_map,CompositeATN<wchar_t> *catn,Identifier *id,Label *rejectlabel,
          MyConstPool *pool)

{
  pointer pAVar1;
  anon_union_8_2_78723da6_for_MemData_2 aVar2;
  CompositeATN<wchar_t> *catn_00;
  int iVar3;
  Operand_ *o0;
  int iVar4;
  long lVar5;
  Operand_ *pOVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  Label requestpage2_label;
  Label requestpage1_label;
  UInt64 local_138;
  UInt64 aUStack_130 [3];
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> local_118;
  Operand_ *local_100;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> local_f8;
  Operand_ *local_d8;
  _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_d0;
  Operand_ *local_c8;
  Operand_ *local_c0;
  CompositeATN<wchar_t> *local_b8;
  Operand_ *local_b0;
  Identifier *local_a8;
  Operand_ *local_a0;
  Operand_ *local_98;
  Operand_ local_90;
  Operand_ local_80;
  ATNPath local_70;
  ATNPath local_50;
  
  local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Label *)0x0;
  local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (Label *)0x0;
  local_d0 = (_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)machine_map;
  local_a8 = id;
  if (0 < (int)((ulong)((long)(machine->m_nodes).
                              super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(machine->m_nodes).
                             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b) {
    iVar4 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_138,as);
      if (local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::_M_realloc_insert<asmjit::Label>
                  (&local_118,
                   (iterator)
                   local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Label *)&local_138.field_10);
      }
      else {
        aVar2.field_1.base = aUStack_130[0].i32[1];
        aVar2.field_1.offsetLo32 = aUStack_130[0].i32[0];
        ((local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._packed[0] =
             local_138;
        ((local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._mem.field_2 =
             aVar2;
        local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar4 = iVar4 + 1;
      iVar3 = (int)((ulong)((long)(machine->m_nodes).
                                  super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(machine->m_nodes).
                                 super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(iVar4,iVar3 * 0x286bca1b) != iVar4 + iVar3 * -0x286bca1b < 0);
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_80,as);
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_90,as);
  pOVar6 = (Operand_ *)(asmjit::x86OpData + 0x480);
  local_98 = (Operand_ *)(asmjit::x86OpData + 0x4e0);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)(asmjit::x86OpData + 0x4e0));
  local_a0 = (Operand_ *)(asmjit::x86OpData + 0x4d0);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)(asmjit::x86OpData + 0x4d0));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4b0),
             machine->m_globalid | 0x8000);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x2ae,(Operand_ *)(asmjit::x86OpData + 0x4b0),0x30);
  local_b0 = (Operand_ *)(asmjit::x86OpData + 0x4b0);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x1b9,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)(asmjit::x86OpData + 0x4b0));
  local_138.i64 = 0x32;
  aUStack_130[0].i32[1] = 7;
  aUStack_130[0].i32[0] = 0;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x19c,(Operand_ *)&local_138.field_10,
             (Operand_ *)(asmjit::x86OpData + 0x480));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,7,(Operand_ *)(asmjit::x86OpData + 0x4f0),8);
  local_100 = (Operand_ *)(asmjit::x86OpData + 0x4a0);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x4f0),
             (Operand_ *)(asmjit::x86OpData + 0x4a0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x118,&local_80);
  local_b8 = catn;
  if (0 < (int)((ulong)((long)(machine->m_nodes).
                              super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(machine->m_nodes).
                             super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b) {
    lVar7 = 0;
    local_c8 = (Operand_ *)(asmjit::x86OpData + 0x480);
    local_d8 = (Operand_ *)(asmjit::x86OpData + 0x4b0);
    local_c0 = (Operand_ *)(asmjit::x86OpData + 0x4f0);
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
                (as,(Operand_ *)
                    (local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar7));
      pAVar1 = (machine->m_nodes).
               super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      switch(pAVar1[lVar7].m_type) {
      case Nonterminal:
        o0 = (Operand_ *)
             std::__detail::
             _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_d0,&pAVar1[lVar7].m_invoke);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x3b,o0);
        break;
      case LiteralTerminal:
        MatchRoutineEM64T<wchar_t>::emit(as,pool,rejectlabel,&pAVar1[lVar7].m_literal);
        break;
      case RegularTerminal:
        DFA<wchar_t>::DFA((DFA<wchar_t> *)&local_138.field_10,&pAVar1[lVar7].m_nfa,true);
        DFARoutineEM64T<wchar_t>::emit(as,rejectlabel,(DFA<wchar_t> *)&local_138.field_10,pool);
        local_138.f64 = (double)&PTR__NFABase_001a1178;
        std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>::
        ~vector((vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                 *)&aUStack_130[0].field_10);
        break;
      case WhiteSpace:
        SkipRoutineEM64T<wchar_t>::emit(as);
      }
      lVar5 = *(long *)&pAVar1[lVar7].m_transitions.
                        super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                        ._M_impl.super__Vector_impl_data;
      uVar8 = (int)((long)pAVar1[lVar7].m_transitions.
                          super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lVar5 >> 3) * -0x55555555;
      if (uVar8 == 1) {
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x11e,
                   (Operand_ *)
                   (local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start + *(int *)(lVar5 + 0xc)));
      }
      else if (uVar8 == 0) {
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x189,pOVar6,local_98);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x2c4,pOVar6,local_a0);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x189,local_d8,machine->m_globalid);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x2ae,local_d8,0x30);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x1b9,pOVar6,local_b0);
        local_138.i64 = 0x32;
        aUStack_130[0].i32[1] = 7;
        aUStack_130[0].i32[0] = 0;
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x19c,(Operand_ *)&local_138.field_10,pOVar6);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,7,local_c0,8);
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x4f0),local_100);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x118,&local_90);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x276);
      }
      else {
        local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (Label *)0x0;
        local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_finish = (Label *)0x0;
        if (0 < (int)uVar8) {
          uVar9 = (ulong)(uVar8 & 0x7fffffff);
          lVar5 = 0xc;
          do {
            pOVar6 = (Operand_ *)
                     (local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                     *(int *)(*(long *)&pAVar1[lVar7].m_transitions.
                                        super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar5));
            if (local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<asmjit::Label,std::allocator<asmjit::Label>>::
              _M_realloc_insert<asmjit::Label_const&>
                        ((vector<asmjit::Label,std::allocator<asmjit::Label>> *)&local_f8,
                         (iterator)
                         local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Label *)pOVar6);
            }
            else {
              aVar2 = (pOVar6->field_0)._mem.field_2;
              ((local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._packed[0]
                   = (pOVar6->field_0)._packed[0];
              ((local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._mem.
              field_2 = aVar2;
              local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar5 = lVar5 + 0x18;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        ATNPath::ATNPath(&local_70,local_a8,(int)lVar7);
        catn_00 = local_b8;
        CompositeATN<wchar_t>::convert_atn_path(&local_50,local_b8,&local_70);
        LookaheadDFA<wchar_t>::LookaheadDFA
                  ((LookaheadDFA<wchar_t> *)&local_138.field_10,catn_00,&local_50,true);
        LDFARoutineEM64T<wchar_t>::emit
                  (as,rejectlabel,(LookaheadDFA<wchar_t> *)&local_138.field_10,&local_f8);
        pOVar6 = local_c8;
        local_138.f64 = (double)&PTR__NFABase_001a1358;
        std::vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
        ::~vector((vector<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                   *)&aUStack_130[0].field_10);
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&local_50.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&local_70.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
        if (local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)(machine->m_nodes).
                                         super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(machine->m_nodes).
                                        super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x286bca1b);
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&local_80);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4e0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4d0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,400,(Operand_ *)(asmjit::x86OpData + 0x7f0),
             (Operand_ *)(asmjit::x86OpData + 0x710));
  local_138.i64 = 0x32;
  aUStack_130[0].i32[1] = 4;
  aUStack_130[0].i32[0] = 8;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),
             (Operand_ *)&local_138.field_10);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x2a5);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x3b,0x129380);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),pOVar6);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,local_100,(Operand_ *)(asmjit::x86OpData + 0x4f0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,7,(Operand_ *)(asmjit::x86OpData + 0x4a0),0x800000);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,400,(Operand_ *)(asmjit::x86OpData + 0x710),
             (Operand_ *)(asmjit::x86OpData + 0x7f0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x510));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x500));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4d0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4e0));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x11e,
             (Operand_ *)
             local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_start);
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&local_90);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4e0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4d0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,400,(Operand_ *)(asmjit::x86OpData + 0x7f0),
             (Operand_ *)(asmjit::x86OpData + 0x710));
  local_138.i64 = 0x32;
  aUStack_130[0].i32[1] = 4;
  aUStack_130[0].i32[0] = 8;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),
             (Operand_ *)&local_138.field_10);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x2a5);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x3b,0x129380);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),pOVar6);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,local_100,(Operand_ *)(asmjit::x86OpData + 0x4f0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,7,(Operand_ *)(asmjit::x86OpData + 0x4a0),0x800000);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,400,(Operand_ *)(asmjit::x86OpData + 0x710),
             (Operand_ *)(asmjit::x86OpData + 0x7f0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x510));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x500));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4d0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4e0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x276);
  if ((Operand_ *)
      local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_start != (Operand_ *)0x0) {
    operator_delete(local_118.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ParserEM64T<TCHAR>::emit_machine(asmjit::X86Assembler& as, const ATNMachine<TCHAR>& machine, std::unordered_map<Identifier, asmjit::Label>& machine_map, const CompositeATN<TCHAR>& catn, const Identifier& id, asmjit::Label& rejectlabel, MyConstPool& pool)
{
    std::vector<asmjit::Label> statelabels;

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }

    asmjit::Label requestpage1_label = as.newLabel();
    asmjit::Label requestpage2_label = as.newLabel();

    {
        //Write the start marker to the AST buffer.
        //Structure of the start marker (64 bits, Little Endian):
        //64  63       48               0
        //+---+--------+----------------+
        //| 1 | ATN ID | Start Position |
        //+---+--------+----------------+
        
        as.mov(MARKER_REG, INPUT_REG);
        as.sub(MARKER_REG, INPUT_BASE_REG);
        as.mov(ID_REG, machine.get_unique_id() | (1 << 15));
        as.shl(ID_REG, 48);
        as.or_(MARKER_REG, ID_REG);
        as.movnti(asmjit::X86Mem(OUTPUT_REG, 0), MARKER_REG);
        as.add(OUTPUT_REG, 8);
        as.cmp(OUTPUT_REG, OUTPUT_BOUND_REG);
        as.je(requestpage1_label);
    }

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        as.bind(statelabels[i]);

        const ATNNode<TCHAR>& node = machine.get_node(i);

        switch (node.type())
        {
        case ATNNodeType::Blank:
            break;
        case ATNNodeType::LiteralTerminal:
            MatchRoutineEM64T<TCHAR>::emit(as, pool, rejectlabel, node.get_literal());
            break;
        case ATNNodeType::Nonterminal:
            as.call(machine_map[node.get_invoke()]);
            break;
        case ATNNodeType::RegularTerminal:
            DFARoutineEM64T<TCHAR>::emit(as, rejectlabel, DFA<TCHAR>(node.get_nfa()), pool);
            break;
        case ATNNodeType::WhiteSpace:
            SkipRoutineEM64T<TCHAR>::emit(as);
            break;
        }

        int outbound_num = node.get_transitions().size();
        if (outbound_num == 0)
        {
            //Write the end marker to the AST buffer.
            //Structure of the end marker:
            //64  63       48             0
            //+---+--------+--------------+
            //| 0 | ATN ID | End Position |
            //+---+--------+--------------+

            as.mov(MARKER_REG, INPUT_REG);
            as.sub(MARKER_REG, INPUT_BASE_REG);
            as.mov(ID_REG, machine.get_unique_id());
            as.shl(ID_REG, 48);
            as.or_(MARKER_REG, ID_REG);
            as.movnti(asmjit::X86Mem(OUTPUT_REG, 0), MARKER_REG);
            as.add(OUTPUT_REG, 8);
            as.cmp(OUTPUT_REG, OUTPUT_BOUND_REG);
            as.je(requestpage2_label);
            as.ret();
        }
        else if (outbound_num == 1)
        {
            as.jmp(statelabels[node.get_transition(0).dest()]);
        }
        else
        {
            std::vector<asmjit::Label> exitlabels;

            for (int j = 0; j < outbound_num; j++)
            {
                exitlabels.push_back(statelabels[node.get_transition(j).dest()]);
            }

            LDFARoutineEM64T<TCHAR>::emit(as, rejectlabel, LookaheadDFA<TCHAR>(catn, catn.convert_atn_path(ATNPath(id, i))), exitlabels);
        }
    }

    as.bind(requestpage1_label);
    {
        as.push(INPUT_REG);
        as.push(INPUT_BASE_REG);
        as.push(CONTEXT_REG);
        as.push(STACK_BACKUP_REG);
        as.movdqa(asmjit::x86::xmm15, PATTERN_REG);
        as.mov(ARG1_REG, asmjit::X86Mem(asmjit::x86::rsp, 8));
#if defined(CENTAURUS_BUILD_WINDOWS)
        as.sub(asmjit::x86::rsp, 32);
#endif
        as.sfence();
        as.call((uint64_t)request_page);
#if defined(CENTAURUS_BUILD_WINDOWS)
        as.add(asmjit::x86::rsp, 32);
#endif
        as.mov(OUTPUT_REG, asmjit::x86::rax);
        as.mov(OUTPUT_BOUND_REG, OUTPUT_REG);
        as.add(OUTPUT_BOUND_REG, AST_BUF_SIZE);
        as.movdqa(PATTERN_REG, asmjit::x86::xmm15);
        as.pop(STACK_BACKUP_REG);
        as.pop(CONTEXT_REG);
        as.pop(INPUT_BASE_REG);
        as.pop(INPUT_REG);

        as.jmp(statelabels[0]);
    }
    as.bind(requestpage2_label);
    {
        as.push(INPUT_REG);
        as.push(INPUT_BASE_REG);
        as.push(CONTEXT_REG);
        as.push(STACK_BACKUP_REG);
        as.movdqa(asmjit::x86::xmm15, PATTERN_REG);
        as.mov(ARG1_REG, asmjit::X86Mem(asmjit::x86::rsp, 8));
#if defined(CENTAURUS_BUILD_WINDOWS)
        as.sub(asmjit::x86::rsp, 32);
#endif
        as.sfence();
        as.call((uint64_t)request_page);
#if defined(CENTAURUS_BUILD_WINDOWS)
        as.add(asmjit::x86::rsp, 32);
#endif
        as.mov(OUTPUT_REG, asmjit::x86::rax);
        as.mov(OUTPUT_BOUND_REG, OUTPUT_REG);
        as.add(OUTPUT_BOUND_REG, AST_BUF_SIZE);
        as.movdqa(PATTERN_REG, asmjit::x86::xmm15);
        as.pop(STACK_BACKUP_REG);
        as.pop(CONTEXT_REG);
        as.pop(INPUT_BASE_REG);
        as.pop(INPUT_REG);

        as.ret();
    }
}